

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O0

edata_t * pac_alloc_real(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,size_t size,size_t alignment,
                        _Bool zero,_Bool guarded)

{
  byte bVar1;
  _Bool _Var2;
  edata_t *expand_edata;
  byte bVar3;
  pac_t *in_RCX;
  long *plVar4;
  pac_t *in_RDX;
  tsdn_t *in_RSI;
  ecache_t *in_R8;
  byte in_R9B;
  byte in_stack_00000008;
  size_t in_stack_00000020;
  edata_t *edata;
  undefined2 uVar5;
  edata_t *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  pac_t *pac_00;
  tsdn_t *tsdn_00;
  
  bVar3 = in_R9B & 1;
  bVar1 = in_stack_00000008 & 1;
  pac_00 = in_RDX;
  tsdn_00 = in_RSI;
  expand_edata = duckdb_je_ecache_alloc
                           ((tsdn_t *)in_RDX,in_RCX,(ehooks_t *)in_R8,
                            (ecache_t *)
                            (CONCAT17(in_R9B,CONCAT16(in_stack_00000008,in_stack_ffffffffffffffa0))
                            & 0x101ffffffffffff),in_stack_ffffffffffffff98,(size_t)in_RSI,
                            in_stack_00000020,SUB81((ulong)in_RDX >> 0x38,0),
                            SUB81((ulong)in_RDX >> 0x30,0));
  uVar5 = (undefined2)((ulong)in_RDX >> 0x30);
  if ((expand_edata == (edata_t *)0x0) && (_Var2 = pac_may_have_muzzy((pac_t *)0x254874c), _Var2)) {
    expand_edata = duckdb_je_ecache_alloc
                             ((tsdn_t *)pac_00,in_RCX,(ehooks_t *)in_R8,
                              (ecache_t *)CONCAT17(bVar3,CONCAT16(bVar1,in_stack_ffffffffffffffa0)),
                              expand_edata,(size_t)in_RSI,in_stack_00000020,
                              SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0));
  }
  if ((expand_edata == (edata_t *)0x0) &&
     (expand_edata = duckdb_je_ecache_alloc_grow
                               (tsdn_00,pac_00,(ehooks_t *)in_RCX,in_R8,
                                (edata_t *)CONCAT17(bVar3,CONCAT16(bVar1,in_stack_ffffffffffffffa0))
                                ,0,in_stack_00000020,SUB81((ulong)in_RSI >> 0x38,0),
                                SUB81((ulong)in_RSI >> 0x30,0)), expand_edata != (edata_t *)0x0)) {
    plVar4 = (long *)(tsdn_00[0x17].tsd.cant_access_tsd_items_directly_use_a_getter_or_setter_tcache
                      .bins[0x1a].tstats.nrequests + 0x38);
    LOCK();
    *plVar4 = (long)&(in_RCX->pai).alloc + *plVar4;
    UNLOCK();
  }
  return expand_edata;
}

Assistant:

static edata_t *
pac_alloc_real(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, size_t size,
    size_t alignment, bool zero, bool guarded) {
	assert(!guarded || alignment <= PAGE);

	edata_t *edata = ecache_alloc(tsdn, pac, ehooks, &pac->ecache_dirty,
	    NULL, size, alignment, zero, guarded);

	if (edata == NULL && pac_may_have_muzzy(pac)) {
		edata = ecache_alloc(tsdn, pac, ehooks, &pac->ecache_muzzy,
		    NULL, size, alignment, zero, guarded);
	}
	if (edata == NULL) {
		edata = ecache_alloc_grow(tsdn, pac, ehooks,
		    &pac->ecache_retained, NULL, size, alignment, zero,
		    guarded);
		if (config_stats && edata != NULL) {
			atomic_fetch_add_zu(&pac->stats->pac_mapped, size,
			    ATOMIC_RELAXED);
		}
	}

	return edata;
}